

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evalstmt.c
# Opt level: O2

void stmt_eval(astnode *ptr)

{
  int iVar1;
  long lVar2;
  
  do {
    if (ptr == (astnode *)0x0) {
      return;
    }
    iVar1 = ptr->type;
    if (iVar1 == 0x140) {
      stmt_eval((astnode *)ptr->left);
      lVar2 = 0x10;
    }
    else {
      lVar2 = 8;
      if (iVar1 != 0x141) {
        if (iVar1 == 0x125) {
          expr_eval((astnode *)ptr->left);
          return;
        }
        yyerror("Warning: Unknown statement type");
        return;
      }
    }
    ptr = *(astnode **)((long)&ptr->type + lVar2);
  } while( true );
}

Assistant:

void stmt_eval(struct astnode *ptr)
{
	
	if(ptr==NULL)
	{
		
		return;
		
	}
	
	switch(ptr->type)
	{
		
		case COMPOUND:
			//Enter frame
			stmt_eval(ptr->left);
			//Leave frame
			break;
			
		case STATEMENT:
			stmt_eval(ptr->left);
			stmt_eval(ptr->right);
			//Left is current statement
			//Right is next statement
			break;
			
		case RETURN:
			expr_eval(ptr->left);
			//Return assembly
			break;
		
		default:
			yyerror("Warning: Unknown statement type");
			break;
		
	}
	
	return;
	
}